

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void burstsort2_sampling_brodnik(uchar **strings,size_t n)

{
  byte bVar1;
  ulong uVar2;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root;
  pointer ppvVar3;
  undefined8 *puVar4;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *this;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  byte *pbVar5;
  long lVar6;
  uint index;
  ulong uVar7;
  _func_void_uchar_ptr_ptr_int_int *p_Var8;
  
  root = (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n != 0) {
    lVar6 = 5000;
    uVar7 = 0;
    do {
      pbVar5 = strings[uVar7];
      this = root;
      if (pbVar5 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      while( true ) {
        bVar1 = *pbVar5;
        if (bVar1 == 0) break;
        ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                 ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3);
        if (in_RCX < (_func_void_uchar_ptr_ptr_int_int *)((ulong)bVar1 + 1)) {
          std::vector<void_*,_std::allocator<void_*>_>::resize
                    (&this->_buckets,(size_type)((ulong)bVar1 + 1));
          ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3);
        }
        index = (uint)bVar1;
        p_Var8 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)index;
        if ((in_RCX <= p_Var8) || (((ulong)ppvVar3[(long)p_Var8] & 1) == 0)) {
          puVar4 = (undefined8 *)operator_new(0x18);
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4[2] = 0;
          *(undefined8 **)
           ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + (ulong)(index * 8)) = puVar4;
          ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar2 = *(ulong *)((long)ppvVar3 + (ulong)(index * 8));
          if (uVar2 == 0) {
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x5c,"void make_trie(void *&)");
          }
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(uVar2 | 1);
          ppvVar3[(long)p_Var8] = in_RCX;
          lVar6 = lVar6 + -1;
          if (lVar6 == 0) goto LAB_001ab18f;
        }
        this = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node(this,index);
        pbVar5 = pbVar5 + 1;
        if (this == (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xd9,
                        "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = vector_brodnik<unsigned char *>]"
                       );
        }
      }
      uVar7 = uVar7 + 0x2000;
    } while (uVar7 < n);
  }
LAB_001ab18f:
  insert<16384u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_brodnik(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_brodnik<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}